

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spl_sqrt_floor.c
# Opt level: O0

int32_t WebRtcSpl_SqrtFloor(int32_t value)

{
  int iVar1;
  undefined4 local_10;
  int32_t try1;
  int32_t root;
  int32_t value_local;
  
  local_10 = 0;
  try1 = value;
  if (0x3fffffff < value) {
    try1 = value + -0x40000000;
    local_10 = 0x10000;
  }
  if ((int)((local_10 + 0x4000) * 0x4000) <= try1) {
    try1 = try1 + (local_10 + 0x4000) * -0x4000;
    local_10 = local_10 | 0x8000;
  }
  if ((int)((local_10 + 0x2000) * 0x2000) <= try1) {
    try1 = try1 + (local_10 + 0x2000) * -0x2000;
    local_10 = local_10 | 0x4000;
  }
  if ((int)((local_10 + 0x1000) * 0x1000) <= try1) {
    try1 = try1 + (local_10 + 0x1000) * -0x1000;
    local_10 = local_10 | 0x2000;
  }
  if ((int)((local_10 + 0x800) * 0x800) <= try1) {
    try1 = try1 + (local_10 + 0x800) * -0x800;
    local_10 = local_10 | 0x1000;
  }
  if ((int)((local_10 + 0x400) * 0x400) <= try1) {
    try1 = try1 + (local_10 + 0x400) * -0x400;
    local_10 = local_10 | 0x800;
  }
  if ((int)((local_10 + 0x200) * 0x200) <= try1) {
    try1 = try1 + (local_10 + 0x200) * -0x200;
    local_10 = local_10 | 0x400;
  }
  if ((int)((local_10 + 0x100) * 0x100) <= try1) {
    try1 = try1 + (local_10 + 0x100) * -0x100;
    local_10 = local_10 | 0x200;
  }
  if ((int)((local_10 + 0x80) * 0x80) <= try1) {
    try1 = try1 + (local_10 + 0x80) * -0x80;
    local_10 = local_10 | 0x100;
  }
  if ((int)((local_10 + 0x40) * 0x40) <= try1) {
    try1 = try1 + (local_10 + 0x40) * -0x40;
    local_10 = local_10 | 0x80;
  }
  if ((int)((local_10 + 0x20) * 0x20) <= try1) {
    try1 = try1 + (local_10 + 0x20) * -0x20;
    local_10 = local_10 | 0x40;
  }
  if ((int)((local_10 + 0x10) * 0x10) <= try1) {
    try1 = try1 + (local_10 + 0x10) * -0x10;
    local_10 = local_10 | 0x20;
  }
  if ((int)((local_10 + 8) * 8) <= try1) {
    try1 = try1 + (local_10 + 8) * -8;
    local_10 = local_10 | 0x10;
  }
  if ((int)((local_10 + 4) * 4) <= try1) {
    try1 = try1 + (local_10 + 4) * -4;
    local_10 = local_10 | 8;
  }
  iVar1 = local_10 + 2;
  if (SBORROW4(try1,iVar1 * 2) == try1 + iVar1 * -2 < 0) {
    try1 = try1 + iVar1 * -2;
    local_10 = local_10 | 4;
  }
  if ((int)(local_10 + 1) <= try1) {
    local_10 = local_10 | 2;
  }
  return (int)local_10 >> 1;
}

Assistant:

int32_t WebRtcSpl_SqrtFloor(int32_t value)
{
  int32_t root = 0, try1;

  WEBRTC_SPL_SQRT_ITER (15);
  WEBRTC_SPL_SQRT_ITER (14);
  WEBRTC_SPL_SQRT_ITER (13);
  WEBRTC_SPL_SQRT_ITER (12);
  WEBRTC_SPL_SQRT_ITER (11);
  WEBRTC_SPL_SQRT_ITER (10);
  WEBRTC_SPL_SQRT_ITER ( 9);
  WEBRTC_SPL_SQRT_ITER ( 8);
  WEBRTC_SPL_SQRT_ITER ( 7);
  WEBRTC_SPL_SQRT_ITER ( 6);
  WEBRTC_SPL_SQRT_ITER ( 5);
  WEBRTC_SPL_SQRT_ITER ( 4);
  WEBRTC_SPL_SQRT_ITER ( 3);
  WEBRTC_SPL_SQRT_ITER ( 2);
  WEBRTC_SPL_SQRT_ITER ( 1);
  WEBRTC_SPL_SQRT_ITER ( 0);

  return root >> 1;
}